

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptLexer.cpp
# Opt level: O0

String __thiscall MiniScript::Token::ToString(Token *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined4 *in_RSI;
  String SVar3;
  String local_60;
  String local_50;
  String local_40 [2];
  undefined1 local_19;
  Token *this_local;
  String *result;
  
  local_19 = 0;
  this_local = this;
  String::String((String *)this);
  switch(*in_RSI) {
  case 0:
    String::operator=((String *)this,"Unknown");
    break;
  case 1:
    String::operator=((String *)this,"Keyword");
    break;
  case 2:
    String::operator=((String *)this,"Number");
    break;
  case 3:
    String::operator=((String *)this,"String");
    break;
  case 4:
    String::operator=((String *)this,"Identifier");
    break;
  case 5:
    String::operator=((String *)this,"OpAssign");
    break;
  case 6:
    String::operator=((String *)this,"OpPlus");
    break;
  case 7:
    String::operator=((String *)this,"OpMinus");
    break;
  case 8:
    String::operator=((String *)this,"OpTimes");
    break;
  case 9:
    String::operator=((String *)this,"OpDivide");
    break;
  case 10:
    String::operator=((String *)this,"OpMod");
    break;
  case 0xb:
    String::operator=((String *)this,"OpPower");
    break;
  case 0xc:
    String::operator=((String *)this,"OpEqual");
    break;
  case 0xd:
    String::operator=((String *)this,"OpNotEqual");
    break;
  case 0xe:
    String::operator=((String *)this,"OpGreater");
    break;
  case 0xf:
    String::operator=((String *)this,"OpGreatEqual");
    break;
  case 0x10:
    String::operator=((String *)this,"OpLesser");
    break;
  case 0x11:
    String::operator=((String *)this,"OpLessEqual");
    break;
  case 0x12:
    String::operator=((String *)this,"OpAssignPlus");
    break;
  case 0x13:
    String::operator=((String *)this,"OpAssignMinus");
    break;
  case 0x14:
    String::operator=((String *)this,"OpAssignTimes");
    break;
  case 0x15:
    String::operator=((String *)this,"OpAssignDivide");
    break;
  case 0x16:
    String::operator=((String *)this,"OpAssignMod");
    break;
  case 0x17:
    String::operator=((String *)this,"OpAssignPower");
    break;
  case 0x18:
    String::operator=((String *)this,"LParen");
    break;
  case 0x19:
    String::operator=((String *)this,"RParen");
    break;
  case 0x1a:
    String::operator=((String *)this,"LSquare");
    break;
  case 0x1b:
    String::operator=((String *)this,"RSquare");
    break;
  case 0x1c:
    String::operator=((String *)this,"LCurly");
    break;
  case 0x1d:
    String::operator=((String *)this,"RCurly");
    break;
  case 0x1e:
    String::operator=((String *)this,"AddressOf");
    break;
  case 0x1f:
    String::operator=((String *)this,"Comma");
    break;
  case 0x20:
    String::operator=((String *)this,"Dot");
    break;
  case 0x21:
    String::operator=((String *)this,"Colon");
    break;
  case 0x22:
    String::operator=((String *)this,"Comment");
    break;
  case 0x23:
    String::operator=((String *)this,"EOL");
  }
  bVar1 = String::empty((String *)(in_RSI + 2));
  uVar2 = extraout_RDX;
  if (!bVar1) {
    String::operator+(&local_60,(char *)this);
    String::operator+(&local_50,&local_60);
    String::operator+(local_40,(char *)&local_50);
    String::operator=((String *)this,local_40);
    String::~String(local_40);
    String::~String(&local_50);
    String::~String(&local_60);
    uVar2 = extraout_RDX_00;
  }
  SVar3._8_8_ = uVar2;
  SVar3.ss = (StringStorage *)this;
  return SVar3;
}

Assistant:

String Token::ToString() {
		String result;
		switch (type) {
			case Token::Type::Unknown: 			result = "Unknown"; 		break;
			case Token::Type::Keyword: 			result = "Keyword"; 		break;
			case Token::Type::Number: 			result = "Number"; 			break;
			case Token::Type::String: 			result = "String"; 			break;
			case Token::Type::Identifier: 		result = "Identifier"; 		break;
			case Token::Type::OpAssign: 		result = "OpAssign"; 		break;
			case Token::Type::OpPlus: 			result = "OpPlus"; 			break;
			case Token::Type::OpMinus: 			result = "OpMinus"; 		break;
			case Token::Type::OpTimes: 			result = "OpTimes"; 		break;
			case Token::Type::OpDivide: 		result = "OpDivide"; 		break;
			case Token::Type::OpMod: 			result = "OpMod"; 			break;
			case Token::Type::OpPower: 			result = "OpPower"; 		break;
			case Token::Type::OpEqual: 			result = "OpEqual"; 		break;
			case Token::Type::OpNotEqual: 		result = "OpNotEqual"; 		break;
			case Token::Type::OpGreater: 		result = "OpGreater"; 		break;
			case Token::Type::OpGreatEqual: 	result = "OpGreatEqual";	break;
			case Token::Type::OpLesser: 		result = "OpLesser"; 		break;
			case Token::Type::OpLessEqual: 		result = "OpLessEqual"; 	break;
			case Token::Type::OpAssignPlus:		result = "OpAssignPlus";	break;
			case Token::Type::OpAssignMinus:	result = "OpAssignMinus";	break;
			case Token::Type::OpAssignTimes:	result = "OpAssignTimes";	break;
			case Token::Type::OpAssignDivide:	result = "OpAssignDivide";	break;
			case Token::Type::OpAssignMod:		result = "OpAssignMod";		break;
			case Token::Type::OpAssignPower:	result = "OpAssignPower";	break;
			case Token::Type::LParen: 			result = "LParen"; 			break;
			case Token::Type::RParen: 			result = "RParen"; 			break;
			case Token::Type::LSquare:			result = "LSquare"; 		break;
			case Token::Type::RSquare: 			result = "RSquare"; 		break;
			case Token::Type::LCurly: 			result = "LCurly"; 			break;
			case Token::Type::RCurly: 			result = "RCurly"; 			break;
			case Token::Type::AddressOf: 		result = "AddressOf"; 		break;
			case Token::Type::Comma: 			result = "Comma"; 			break;
			case Token::Type::Dot: 				result = "Dot"; 			break;
			case Token::Type::Colon: 			result = "Colon"; 			break;
			case Token::Type::Comment: 			result = "Comment"; 		break;
			case Token::Type::EOL: 				result = "EOL"; 			break;
		}
		if (!text.empty()) result = result + "(" + text + ")";
		return result;
	}